

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QSpanData::setupMatrix(QSpanData *this,QTransform *matrix,int bilin)

{
  bool bVar1;
  TransformationType TVar2;
  int in_EDX;
  QTransform *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  QSpanData *this_00;
  qreal f2;
  qreal f1;
  bool affine;
  QTransform inv;
  QTransform delta;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  bool bVar5;
  qreal in_stack_fffffffffffffee0;
  QTransform *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 local_a8 [48];
  QTransform *in_stack_ffffffffffffff88;
  QTransform *in_stack_ffffffffffffff90;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_58,&DAT_00bbde08,0x50);
  QTransform::QTransform(in_RDI);
  QTransform::translate
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (qreal)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  memcpy(local_a8,&DAT_00bbde58,0x50);
  QTransform::operator*(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QTransform::inverted(in_RSI,(bool *)CONCAT44(in_EDX,in_stack_fffffffffffffef0));
  qVar3 = QTransform::m11((QTransform *)local_a8);
  in_RDI->m_matrix[2][1] = qVar3;
  qVar3 = QTransform::m12((QTransform *)local_a8);
  in_RDI->m_matrix[2][2] = qVar3;
  qVar3 = QTransform::m13((QTransform *)local_a8);
  *(qreal *)&in_RDI->field_0x48 = qVar3;
  qVar3 = QTransform::m21((QTransform *)local_a8);
  in_RDI[1].m_matrix[0][0] = qVar3;
  qVar3 = QTransform::m22((QTransform *)local_a8);
  in_RDI[1].m_matrix[0][1] = qVar3;
  qVar3 = QTransform::m23((QTransform *)local_a8);
  in_RDI[1].m_matrix[0][2] = qVar3;
  qVar3 = QTransform::m33((QTransform *)local_a8);
  in_RDI[1].m_matrix[1][0] = qVar3;
  qVar3 = QTransform::dx((QTransform *)local_a8);
  in_RDI[1].m_matrix[1][1] = qVar3;
  qVar3 = QTransform::dy((QTransform *)local_a8);
  in_RDI[1].m_matrix[1][2] = qVar3;
  TVar2 = QTransform::type((QTransform *)
                           CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  *(ushort *)(in_RDI[1].m_matrix[2] + 1) =
       *(ushort *)(in_RDI[1].m_matrix[2] + 1) & 0xff | (short)TVar2 << 8;
  *(bool *)((long)in_RDI[1].m_matrix[2] + 0xb) = in_EDX != 0;
  bVar1 = QTransform::isAffine((QTransform *)0x56406b);
  dVar4 = in_RDI->m_matrix[2][1] * in_RDI->m_matrix[2][1] +
          in_RDI[1].m_matrix[0][0] * in_RDI[1].m_matrix[0][0];
  this_00 = (QSpanData *)
            (in_RDI->m_matrix[2][2] * in_RDI->m_matrix[2][2] +
            in_RDI[1].m_matrix[0][1] * in_RDI[1].m_matrix[0][1]);
  bVar5 = false;
  if ((((bVar1) && (bVar5 = false, dVar4 < 10000.0)) && (bVar5 = false, (double)this_00 < 10000.0))
     && ((bVar5 = false, 1.52587890625e-05 < dVar4 &&
         (bVar5 = false, 1.52587890625e-05 < (double)this_00)))) {
    dVar4 = qAbs<double>(in_RDI[1].m_matrix[1] + 1);
    bVar5 = false;
    if (dVar4 < 10000.0) {
      dVar4 = qAbs<double>(in_RDI[1].m_matrix[1] + 2);
      bVar5 = dVar4 < 10000.0;
    }
  }
  *(byte *)((long)in_RDI[1].m_matrix[2] + 10) =
       *(byte *)((long)in_RDI[1].m_matrix[2] + 10) & 0xfe | bVar5;
  adjustSpanMethods(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanData::setupMatrix(const QTransform &matrix, int bilin)
{
    QTransform delta;
    // make sure we round off correctly in qdrawhelper.cpp
    delta.translate(1.0 / 65536, 1.0 / 65536);

    QTransform inv = (delta * matrix).inverted();
    m11 = inv.m11();
    m12 = inv.m12();
    m13 = inv.m13();
    m21 = inv.m21();
    m22 = inv.m22();
    m23 = inv.m23();
    m33 = inv.m33();
    dx = inv.dx();
    dy = inv.dy();
    txop = inv.type();
    bilinear = bilin;

    const bool affine = inv.isAffine();
    const qreal f1 = m11 * m11 + m21 * m21;
    const qreal f2 = m12 * m12 + m22 * m22;
    fast_matrix = affine
        && f1 < 1e4
        && f2 < 1e4
        && f1 > (1.0 / 65536)
        && f2 > (1.0 / 65536)
        && qAbs(dx) < 1e4
        && qAbs(dy) < 1e4;

    adjustSpanMethods();
}